

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cpp
# Opt level: O2

int duckdb_brotli::BrotliDecoderStateInit
              (BrotliDecoderStateInternal *s,brotli_alloc_func alloc_func,brotli_free_func free_func
              ,void *opaque)

{
  uint uVar1;
  brotli_alloc_func p_Var2;
  BrotliSharedDictionaryInternal *pBVar3;
  brotli_free_func p_Var4;
  void *pvVar5;
  
  p_Var2 = alloc_func;
  p_Var4 = free_func;
  pvVar5 = opaque;
  if (alloc_func == (brotli_alloc_func)0x0) {
    pvVar5 = (void *)0x0;
    p_Var2 = BrotliDefaultAllocFunc;
    p_Var4 = BrotliDefaultFreeFunc;
  }
  s->alloc_func = p_Var2;
  s->free_func = p_Var4;
  s->memory_manager_opaque = pvVar5;
  s->error_code = 0;
  BrotliInitBitReader(&s->br);
  s->state = BROTLI_STATE_UNINITED;
  s->loop_counter = 0;
  s->buffer_length = 0;
  s->pos = 0;
  s->ringbuffer = (uint8_t *)0x0;
  s->dist_context_map = (uint8_t *)0x0;
  uVar1 = *(uint *)&s->field_0x304;
  s->context_map_slice = (uint8_t *)0x0;
  s->dist_context_map_slice = (uint8_t *)0x0;
  (s->literal_hgroup).htrees = (HuffmanCode **)0x0;
  (s->literal_hgroup).codes = (HuffmanCode *)0x0;
  (s->insert_copy_hgroup).htrees = (HuffmanCode **)0x0;
  (s->insert_copy_hgroup).codes = (HuffmanCode *)0x0;
  (s->distance_hgroup).htrees = (HuffmanCode **)0x0;
  (s->distance_hgroup).codes = (HuffmanCode *)0x0;
  s->rb_roundtrips = 0;
  s->partial_pos_out = 0;
  s->used_input = 0;
  s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NONE;
  s->substate_uncompressed = BROTLI_STATE_UNCOMPRESSED_NONE;
  s->substate_uncompressed = BROTLI_STATE_UNCOMPRESSED_NONE;
  s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_NONE;
  s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;
  s->new_ringbuffer_size = 0;
  s->context_map = (uint8_t *)0x0;
  s->context_modes = (uint8_t *)0x0;
  *(uint *)&s->field_0x304 = uVar1 & 0xfffff000 | 0x10;
  s->dist_rb[0] = 0x10;
  s->dist_rb[1] = 0xf;
  s->dist_rb[2] = 0xb;
  s->dist_rb[3] = 4;
  s->max_distance = 0;
  s->ringbuffer_size = 0;
  s->ringbuffer_mask = 0;
  s->dist_rb_idx = 0;
  s->block_type_trees = (HuffmanCode *)0x0;
  s->block_len_trees = (HuffmanCode *)0x0;
  s->mtf_upper_bound = 0x3f;
  s->compound_dictionary = (BrotliDecoderCompoundDictionary *)0x0;
  pBVar3 = BrotliSharedDictionaryCreateInstance(alloc_func,free_func,opaque);
  s->dictionary = pBVar3;
  if (pBVar3 != (BrotliSharedDictionaryInternal *)0x0) {
    s->metadata_start_func = (brotli_decoder_metadata_start_func)0x0;
    s->metadata_chunk_func = (brotli_decoder_metadata_chunk_func)0x0;
    s->metadata_callback_opaque = (void *)0x0;
  }
  return (uint)(pBVar3 != (BrotliSharedDictionaryInternal *)0x0);
}

Assistant:

BROTLI_BOOL duckdb_brotli::BrotliDecoderStateInit(BrotliDecoderState* s,
    brotli_alloc_func alloc_func, brotli_free_func free_func, void* opaque) {
  if (!alloc_func) {
    s->alloc_func = BrotliDefaultAllocFunc;
    s->free_func = BrotliDefaultFreeFunc;
    s->memory_manager_opaque = 0;
  } else {
    s->alloc_func = alloc_func;
    s->free_func = free_func;
    s->memory_manager_opaque = opaque;
  }

  s->error_code = 0; /* BROTLI_DECODER_NO_ERROR */

  BrotliInitBitReader(&s->br);
  s->state = BROTLI_STATE_UNINITED;
  s->large_window = 0;
  s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NONE;
  s->substate_uncompressed = BROTLI_STATE_UNCOMPRESSED_NONE;
  s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_NONE;
  s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;

  s->buffer_length = 0;
  s->loop_counter = 0;
  s->pos = 0;
  s->rb_roundtrips = 0;
  s->partial_pos_out = 0;
  s->used_input = 0;

  s->block_type_trees = NULL;
  s->block_len_trees = NULL;
  s->ringbuffer = NULL;
  s->ringbuffer_size = 0;
  s->new_ringbuffer_size = 0;
  s->ringbuffer_mask = 0;

  s->context_map = NULL;
  s->context_modes = NULL;
  s->dist_context_map = NULL;
  s->context_map_slice = NULL;
  s->dist_context_map_slice = NULL;

  s->literal_hgroup.codes = NULL;
  s->literal_hgroup.htrees = NULL;
  s->insert_copy_hgroup.codes = NULL;
  s->insert_copy_hgroup.htrees = NULL;
  s->distance_hgroup.codes = NULL;
  s->distance_hgroup.htrees = NULL;

  s->is_last_metablock = 0;
  s->is_uncompressed = 0;
  s->is_metadata = 0;
  s->should_wrap_ringbuffer = 0;
  s->canny_ringbuffer_allocation = 1;

  s->window_bits = 0;
  s->max_distance = 0;
  s->dist_rb[0] = 16;
  s->dist_rb[1] = 15;
  s->dist_rb[2] = 11;
  s->dist_rb[3] = 4;
  s->dist_rb_idx = 0;
  s->block_type_trees = NULL;
  s->block_len_trees = NULL;

  s->mtf_upper_bound = 63;

  s->compound_dictionary = NULL;
  s->dictionary =
      BrotliSharedDictionaryCreateInstance(alloc_func, free_func, opaque);
  if (!s->dictionary) return BROTLI_FALSE;

  s->metadata_start_func = NULL;
  s->metadata_chunk_func = NULL;
  s->metadata_callback_opaque = 0;

  return BROTLI_TRUE;
}